

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
GetPropertyEquivalenceInfo
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  PropertyIndex PVar6;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryPropertyDescriptor<int> *pSStack_20;
  int i;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  ushort uVar7;
  
  local_30 = propertyRecord;
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_30,&stack0xffffffffffffffe0,
                     (int *)((long)&propertyRecord_local + 4));
  if ((bVar3) && (bVar1 = pSStack_20->Attributes, (bVar1 & 8) == 0)) {
    iVar5 = 0xffff;
    if (pSStack_20->propertyIndex < 0xffff) {
      iVar5 = pSStack_20->propertyIndex;
    }
    uVar2 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
    uVar4 = (ushort)iVar5;
    if (uVar4 == 0xffff) {
      PVar6 = 0xffff;
    }
    else {
      uVar7 = -uVar2;
      if (uVar4 < uVar2) {
        uVar7 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
      }
      PVar6 = uVar7 + uVar4;
    }
    info->slotIndex = PVar6;
    info->isAuxSlot = uVar2 < uVar4;
    info->isWritable = (bool)(bVar1 >> 2 & 1);
    return PVar6 != 0xffff;
  }
  info->slotIndex = 0xffff;
  info->isAuxSlot = false;
  info->isWritable = false;
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            Js::PropertyIndex absSlotIndex = DisallowBigPropertyIndex(descriptor->propertyIndex);
            info.slotIndex = AdjustSlotIndexForInlineSlots(absSlotIndex);
            info.isAuxSlot = absSlotIndex > GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }